

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::OptionBase<CLI::OptionDefaults>::copy_to<CLI::Option>
          (OptionBase<CLI::OptionDefaults> *this,Option *other)

{
  Option *in_RSI;
  long in_RDI;
  string *in_stack_00000038;
  OptionBase<CLI::Option> *in_stack_00000040;
  bool in_stack_0000005f;
  Option *in_stack_00000060;
  
  OptionBase<CLI::Option>::group(in_stack_00000040,in_stack_00000038);
  OptionBase<CLI::Option>::required
            (&in_RSI->super_OptionBase<CLI::Option>,(bool)(*(byte *)(in_RDI + 0x20) & 1));
  Option::ignore_case<CLI::App>(in_stack_00000060,in_stack_0000005f);
  Option::ignore_underscore<CLI::App>(in_stack_00000060,in_stack_0000005f);
  OptionBase<CLI::Option>::configurable
            (&in_RSI->super_OptionBase<CLI::Option>,(bool)(*(byte *)(in_RDI + 0x23) & 1));
  Option::disable_flag_override(in_RSI,(bool)(*(byte *)(in_RDI + 0x24) & 1));
  OptionBase<CLI::Option>::delimiter
            (&in_RSI->super_OptionBase<CLI::Option>,*(char *)(in_RDI + 0x25));
  OptionBase<CLI::Option>::always_capture_default
            (&in_RSI->super_OptionBase<CLI::Option>,(bool)(*(byte *)(in_RDI + 0x26) & 1));
  Option::multi_option_policy(in_RSI,*(MultiOptionPolicy *)(in_RDI + 0x27));
  return;
}

Assistant:

void OptionBase<CRTP>::copy_to(T *other) const {
    other->group(group_);
    other->required(required_);
    other->ignore_case(ignore_case_);
    other->ignore_underscore(ignore_underscore_);
    other->configurable(configurable_);
    other->disable_flag_override(disable_flag_override_);
    other->delimiter(delimiter_);
    other->always_capture_default(always_capture_default_);
    other->multi_option_policy(multi_option_policy_);
}